

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_freeCCtxPool(ZSTDMT_CCtxPool *pool)

{
  ZSTD_customMem customMem;
  pthread_mutex_t *in_RDI;
  void *unaff_retaddr;
  int cid;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < in_RDI[1].__data.__lock; iVar1 = iVar1 + 1) {
    ZSTD_freeCCtx((ZSTD_CCtx *)&in_RDI->__data);
  }
  pthread_mutex_destroy(in_RDI);
  customMem.customAlloc._4_4_ = iVar1;
  customMem.customAlloc._0_4_ = in_stack_fffffffffffffff0;
  customMem.customFree = (ZSTD_freeFunction)in_RDI;
  customMem.opaque = unaff_retaddr;
  ZSTD_customFree(*(void **)((long)in_RDI + 0x38),customMem);
  return;
}

Assistant:

static void ZSTDMT_freeCCtxPool(ZSTDMT_CCtxPool* pool)
{
    int cid;
    for (cid=0; cid<pool->totalCCtx; cid++)
        ZSTD_freeCCtx(pool->cctx[cid]);  /* note : compatible with free on NULL */
    ZSTD_pthread_mutex_destroy(&pool->poolMutex);
    ZSTD_customFree(pool, pool->cMem);
}